

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intrusive_list.cpp
# Opt level: O3

void __thiscall IntrusiveList_OneElement_Test::TestBody(IntrusiveList_OneElement_Test *this)

{
  __uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
  _Var1;
  _Head_base<0UL,_(anonymous_namespace)::value_*,_false> _Var2;
  char *pcVar3;
  intrusive_list<(anonymous_namespace)::value> v;
  value member;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  intrusive_list<(anonymous_namespace)::value> local_40;
  value local_30;
  
  local_30.v = 0x2f;
  local_30.list_memb.prev = (value *)0x0;
  local_30.list_memb.next = (value *)0x0;
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::intrusive_list(&local_40);
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::insert_before
            (&local_40,&local_30,
             (value *)local_40.tail_._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl);
  local_60.data_._0_4_ = 1;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  for (_Var1._M_t.
       super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
       .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl =
            *(tuple<(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
              *)&((_Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                   *)((long)local_40.head_._M_t.
                            super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>.
                            _M_head_impl + 0x10))->
                 super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>;
      _Var1._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl !=
      (tuple<(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>)
      local_40.tail_._M_t.
      super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl;
      _Var1._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl =
           *(tuple<(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
             *)((long)_Var1._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl +
               0x10)) {
    local_58._M_head_impl = local_58._M_head_impl + 1;
  }
  testing::internal::CmpHelperEQ<int,long>
            (local_50,"1","std::distance (v.begin (), v.end ())",(int *)&local_60,(long *)&local_58)
  ;
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
               ,0x2b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  }
  else {
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    local_58._M_head_impl._0_4_ = 0x2f;
    testing::internal::CmpHelperEQ<int,int>
              (local_50,"v.begin ()->v","47",
               *(int **)((long)local_40.head_._M_t.
                               super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                               .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>.
                               _M_head_impl + 0x10),(int *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
                 ,0x2c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    if (local_30.list_memb.prev != (value *)0x0) {
      ((local_30.list_memb.prev)->list_memb).next = local_30.list_memb.next;
    }
    if (local_30.list_memb.next != (value *)0x0) {
      ((local_30.list_memb.next)->list_memb).prev = local_30.list_memb.prev;
    }
    local_60.data_ = local_60.data_ & 0xffffffff00000000;
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    for (_Var2._M_head_impl =
              *(value **)
               ((long)local_40.head_._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl +
               0x10);
        (__uniq_ptr_data<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>,_true,_true>
         )_Var2._M_head_impl !=
        (__uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
         )local_40.tail_._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
          .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl;
        _Var2._M_head_impl = *(value **)((long)_Var2._M_head_impl + 0x10)) {
      local_58._M_head_impl = local_58._M_head_impl + 1;
    }
    testing::internal::CmpHelperEQ<int,long>
              (local_50,"0","std::distance (v.begin (), v.end ())",(int *)&local_60,
               (long *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
                 ,0x2f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    local_58._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          ((long)local_40.head_._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl + 0x10);
    local_60.data_ =
         (AssertHelperData *)
         local_40.tail_._M_t.
         super___uniq_ptr_impl<(anonymous_namespace)::value,_std::default_delete<(anonymous_namespace)::value>_>
         ._M_t.
         super__Tuple_impl<0UL,_(anonymous_namespace)::value_*,_std::default_delete<(anonymous_namespace)::value>_>
         .super__Head_base<0UL,_(anonymous_namespace)::value_*,_false>._M_head_impl;
    testing::internal::EqHelper::
    Compare<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator,_pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator,_nullptr>
              ((EqHelper *)local_50,"v.begin ()","v.end ()",(iterator *)&local_58,
               (iterator *)&local_60);
    if (local_50[0] != (internal)0x0) goto LAB_001251a0;
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_001251a0:
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::~intrusive_list(&local_40);
  return;
}

Assistant:

TEST (IntrusiveList, OneElement) {
    value member{47};

    pstore::broker::intrusive_list<value> v;
    v.insert_before (&member, v.tail ());

    ASSERT_EQ (1, std::distance (v.begin (), v.end ()));
    EXPECT_EQ (v.begin ()->v, 47);

    v.erase (&member);
    EXPECT_EQ (0, std::distance (v.begin (), v.end ()));
    EXPECT_EQ (v.begin (), v.end ());
}